

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int source_set_timeout(SOURCE_HANDLE source,seconds timeout_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  SOURCE_INSTANCE *source_instance;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar2 = 0x31a3;
  }
  else {
    item_value = amqpvalue_create_uint(timeout_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x31ab;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,3,item_value);
      iVar2 = 0x31b1;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int source_set_timeout(SOURCE_HANDLE source, seconds timeout_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE timeout_amqp_value = amqpvalue_create_seconds(timeout_value);
        if (timeout_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 3, timeout_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(timeout_amqp_value);
        }
    }

    return result;
}